

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

void __thiscall duckdb::Pipeline::Schedule(Pipeline *this,shared_ptr<duckdb::Event,_true> *event)

{
  bool bVar1;
  Pipeline *in_stack_00000040;
  shared_ptr<duckdb::Event,_true> *in_stack_00000058;
  Pipeline *in_stack_00000060;
  shared_ptr<duckdb::Event,_true> *in_stack_00000120;
  Pipeline *in_stack_00000128;
  
  Reset(in_stack_00000040);
  bVar1 = ScheduleParallel(in_stack_00000128,in_stack_00000120);
  if (!bVar1) {
    ScheduleSequentialTask(in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

void Pipeline::Schedule(shared_ptr<Event> &event) {
	D_ASSERT(ready);
	D_ASSERT(sink);
	Reset();
	if (!ScheduleParallel(event)) {
		// could not parallelize this pipeline: push a sequential task instead
		ScheduleSequentialTask(event);
	}
}